

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O1

void __thiscall GregorianCalendar::GregorianCalendar(GregorianCalendar *this,int date)

{
  GregorianCalendar *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  GregorianCalendar t;
  GregorianCalendar local_50;
  GregorianCalendar *local_38;
  
  (this->super_Calendar).year = 1;
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ae318;
  uVar6 = date / 0x16e - 1;
  do {
    local_50.super_Calendar.year = uVar6 + 2;
    local_50.super_Calendar.month = 1;
    local_50.super_Calendar.day = 1;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ae318;
    iVar2 = operator_cast_to_int(&local_50);
    uVar6 = uVar6 + 1;
  } while (iVar2 <= date);
  (this->super_Calendar).year = uVar6;
  uVar3 = uVar6 * -0x3d70a3d7 + 0x51eb850;
  uVar5 = 0;
  iVar4 = ((uVar3 >> 4 | uVar6 * -0x70000000) < 0xa3d70b) + 0x1c;
  iVar2 = 0x1d;
  if ((uVar3 >> 2 | uVar6 * 0x40000000) < 0x28f5c29) {
    iVar2 = iVar4;
  }
  if ((uVar6 & 3) != 0) {
    iVar2 = iVar4;
  }
  local_38 = this;
  do {
    uVar5 = uVar5 + 1;
    if ((0xb < uVar5) ||
       ((local_50.super_Calendar.day = 0x1e, (0xa50U >> (uVar5 & 0x1f) & 1) == 0 &&
        (local_50.super_Calendar.day = iVar2, uVar5 != 2)))) {
      local_50.super_Calendar.day = 0x1f;
    }
    local_50.super_Calendar.month = uVar5;
    local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ae318;
    local_50.super_Calendar.year = uVar6;
    iVar4 = operator_cast_to_int(&local_50);
    pGVar1 = local_38;
  } while (iVar4 < date);
  (local_38->super_Calendar).month = uVar5;
  local_50.super_Calendar.day = 1;
  local_50.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001ae318;
  local_50.super_Calendar.year = uVar6;
  iVar2 = operator_cast_to_int(&local_50);
  (pGVar1->super_Calendar).day = (date - iVar2) + 1;
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(int date) {
    year = date / (365 + 1);
    while (date >= GregorianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > GregorianCalendar(month, LastMonthDay(month, year), year))
        month++;
    GregorianCalendar t = GregorianCalendar(month, 1, year);
    day = date - t + 1;
}